

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *complete_cmd;
  int rc;
  char *buf;
  char **argv_local;
  int argc_local;
  
  printf("\n");
  iVar1 = PHYSFS_init(*argv);
  if (iVar1 == 0) {
    uVar2 = PHYSFS_getLastError();
    printf("PHYSFS_init() failed!\n  reason: %s.\n",uVar2);
    argv_local._4_4_ = 1;
  }
  else {
    output_versions();
    output_archivers();
    open_history_file();
    printf("Enter commands. Enter \"help\" for instructions.\n");
    fflush(_stdout);
    do {
      complete_cmd = (char *)readline("> ");
      iVar1 = process_command(complete_cmd);
      fflush(_stdout);
      if (complete_cmd != (char *)0x0) {
        free(complete_cmd);
      }
    } while (iVar1 != 0);
    iVar1 = PHYSFS_deinit();
    if (iVar1 == 0) {
      uVar2 = PHYSFS_getLastError();
      printf("PHYSFS_deinit() failed!\n  reason: %s.\n",uVar2);
    }
    if (history_file != (FILE *)0x0) {
      fclose((FILE *)history_file);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    char *buf = NULL;
    int rc = 0;

#if (defined __MWERKS__)
    extern tSIOUXSettings SIOUXSettings;
    SIOUXSettings.asktosaveonclose = 0;
    SIOUXSettings.autocloseonquit = 1;
    SIOUXSettings.rows = 40;
    SIOUXSettings.columns = 120;
#endif

    printf("\n");

    if (!PHYSFS_init(argv[0]))
    {
        printf("PHYSFS_init() failed!\n  reason: %s.\n", PHYSFS_getLastError());
        return 1;
    } /* if */

    output_versions();
    output_archivers();

    open_history_file();

    printf("Enter commands. Enter \"help\" for instructions.\n");
    fflush(stdout);

    do
    {
#if (defined PHYSFS_HAVE_READLINE)
        buf = readline("> ");
#else
        int i;
        buf = (char *) malloc(512);
        memset(buf, '\0', 512);
        printf("> ");
        fflush(stdout);
        for (i = 0; i < 511; i++)
        {
            int ch = fgetc(stdin);
            if (ch == EOF)
            {
                strcpy(buf, "quit");
                break;
            } /* if */
            else if ((ch == '\n') || (ch == '\r'))
            {
                buf[i] = '\0';
                break;
            } /* else if */
            else if (ch == '\b')
            {
                if (i > 0)
                    i--;
            } /* else if */
            else
            {
                buf[i] = (char) ch;
            } /* else */
        } /* for */
#endif

        rc = process_command(buf);
        fflush(stdout);
        if (buf != NULL)
            free(buf);
    } while (rc);

    if (!PHYSFS_deinit())
        printf("PHYSFS_deinit() failed!\n  reason: %s.\n", PHYSFS_getLastError());

    if (history_file)
        fclose(history_file);

/*
    printf("\n\ntest_physfs written by ryan c. gordon.\n");
    printf(" it makes you shoot teh railgun bettar.\n");
*/

    return 0;
}